

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O3

void __thiscall
xlib::Log::Format<std::__cxx11::string,unsigned_short>
          (Log *this,string *format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first,
          unsigned_short *rest)

{
  ulong uVar1;
  ostringstream oss;
  undefined1 *local_1c8;
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar1 = std::__cxx11::string::find_first_of((char *)format,0x12548e,0);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(first->_M_dataplus)._M_p,first->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)format,uVar1,(char *)0x2,(ulong)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    Format<unsigned_short>(this,format,rest);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void Format(std::string* format,  const First& first, const Rest&... rest) {
        size_t index = format->find_first_of("%v");
        if (index == std::string::npos) {
            return;
        }
        std::ostringstream oss;
        oss << first;
        format->replace(index, 2, oss.str());
        Format(format, rest...);
    }